

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationroot.cpp
# Opt level: O0

CollationCacheEntry * icu_63::CollationRoot::getRootCacheEntry(UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  
  umtx_initOnce((UInitOnce *)&(anonymous_namespace)::initOnce,load,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    errorCode_local = (anonymous_namespace)::rootSingleton;
  }
  else {
    errorCode_local = (UErrorCode *)0x0;
  }
  return (CollationCacheEntry *)errorCode_local;
}

Assistant:

const CollationCacheEntry *
CollationRoot::getRootCacheEntry(UErrorCode &errorCode) {
    umtx_initOnce(initOnce, CollationRoot::load, errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    return rootSingleton;
}